

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Gradient gradient;
  _Vector_base<GradientColor,_std::allocator<GradientColor>_> _Stack_b8;
  _Tuple_impl<0UL,_std::vector<PixelColor,_std::allocator<PixelColor>_>,_std::vector<double,_std::allocator<double>_>_>
  local_a0;
  tuple<ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  eval_args_abi_cxx11_(&local_70,argc,argv);
  load_gradient((Gradient *)&_Stack_b8,
                (string *)
                ((long)&local_70.
                        super__Tuple_impl<0UL,_ImageSize,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<1UL,_Section,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<2UL,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<3UL,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .
                        super__Tuple_impl<4UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                + 0x20));
  go();
  save_image((string *)&local_70,
             &local_a0.
              super__Head_base<0UL,_std::vector<PixelColor,_std::allocator<PixelColor>_>,_false>.
              _M_head_impl);
  show_summary((vector<double,_std::allocator<double>_> *)&local_a0);
  std::
  _Tuple_impl<0UL,_std::vector<PixelColor,_std::allocator<PixelColor>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~_Tuple_impl(&local_a0);
  std::_Vector_base<GradientColor,_std::allocator<GradientColor>_>::~_Vector_base(&_Stack_b8);
  std::
  _Tuple_impl<4UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Tuple_impl((_Tuple_impl<4UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70);
  return 0;
}

Assistant:

int main(int argc, char const* argv[])
{
    auto [image, section, max_iterations, repetitions, gradient_filename, filename] = eval_args(argc, argv);
    auto gradient = load_gradient(gradient_filename);

    auto [image_data, durations] = go(image, section, max_iterations, gradient, repetitions);

    save_image(filename, image_data);
    show_summary(durations);
}